

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

BCReg rec_mm_prep(jit_State *J,ASMFunction cont)

{
  TRef TVar1;
  uint local_24;
  uint local_1c;
  BCReg top;
  BCReg s;
  ASMFunction cont_local;
  jit_State *J_local;
  
  if (cont == lj_cont_cat) {
    local_24 = J->maxslot;
  }
  else {
    local_24 = (uint)*(byte *)(*(long *)((J->L->base[-2].u64 & 0x7fffffffffff) + 0x20) + -0x5d);
  }
  TVar1 = lj_ir_k64(J,IR_KNUM,(uint64_t)cont);
  J->base[local_24] = TVar1;
  J->base[local_24 + 1] = 0x20000;
  J->framedepth = J->framedepth + 1;
  for (local_1c = J->maxslot; local_1c < local_24; local_1c = local_1c + 1) {
    J->base[local_1c] = 0;
  }
  return local_24 + 2;
}

Assistant:

static BCReg rec_mm_prep(jit_State *J, ASMFunction cont)
{
  BCReg s, top = cont == lj_cont_cat ? J->maxslot : curr_proto(J->L)->framesize;
#if LJ_FR2
  J->base[top] = lj_ir_k64(J, IR_KNUM, u64ptr(contptr(cont)));
  J->base[top+1] = TREF_CONT;
#else
  J->base[top] = lj_ir_kptr(J, contptr(cont)) | TREF_CONT;
#endif
  J->framedepth++;
  for (s = J->maxslot; s < top; s++)
    J->base[s] = 0;  /* Clear frame gap to avoid resurrecting previous refs. */
  return top+1+LJ_FR2;
}